

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

char othercase(int ch)

{
  int iVar1;
  ushort **ppuVar2;
  char local_9;
  int ch_local;
  
  ppuVar2 = __ctype_b_loc();
  if (((*ppuVar2)[ch] & 0x400) != 0) {
    ppuVar2 = __ctype_b_loc();
    if (((*ppuVar2)[ch] & 0x100) == 0) {
      ppuVar2 = __ctype_b_loc();
      if (((*ppuVar2)[ch] & 0x200) == 0) {
        local_9 = (char)ch;
      }
      else {
        iVar1 = toupper(ch);
        local_9 = (char)iVar1;
      }
    }
    else {
      iVar1 = tolower(ch);
      local_9 = (char)iVar1;
    }
    return local_9;
  }
  __assert_fail("isalpha(ch)",
                "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                ,0x3c6,"char othercase()");
}

Assistant:

static char			/* if no counterpart, return ch */
othercase(ch)
int ch;
{
	assert(isalpha(ch));
	if (isupper(ch))
		return((char)tolower(ch));
	else if (islower(ch))
		return((char)toupper(ch));
	else			/* peculiar, but could happen */
		return((char)ch);
}